

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall RPCCommandExecution::RPCCommandExecution(RPCCommandExecution *this,string *method)

{
  iterator iVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock2;
  RPCCommandExecutionInfo local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (this->it)._M_node = (_List_node_base *)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock2,&g_rpc_server_info.mutex,"g_rpc_server_info.mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp"
             ,0x3e,false);
  std::__cxx11::string::string((string *)&local_40,method);
  local_40.start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  iVar1 = std::__cxx11::list<RPCCommandExecutionInfo,_std::allocator<RPCCommandExecutionInfo>_>::
          emplace<RPCCommandExecutionInfo>
                    (&g_rpc_server_info.active_commands,(const_iterator)0x116d4e0,&local_40);
  (this->it)._M_node = iVar1._M_node;
  std::__cxx11::string::~string((string *)&local_40);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit RPCCommandExecution(const std::string& method)
    {
        LOCK(g_rpc_server_info.mutex);
        it = g_rpc_server_info.active_commands.insert(g_rpc_server_info.active_commands.end(), {method, SteadyClock::now()});
    }